

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall UnscentedKalmanFilter::Prediction(UnscentedKalmanFilter *this,double delta_t)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  undefined8 *puVar5;
  long nbCols;
  undefined8 in_RSI;
  long nbRows;
  MatrixXd Xsig_aug;
  DenseStorage<double,__1,__1,__1,_0> local_38;
  
  local_38.m_data = (double *)0x0;
  local_38.m_rows = 0;
  local_38.m_cols = 0;
  uVar1 = this->n_aug_;
  nbRows = (long)(int)uVar1;
  uVar2 = this->n_sigma_;
  nbCols = (long)(int)uVar2;
  if ((int)(uVar2 | uVar1) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((uVar2 != 0 && uVar1 != 0) &&
     (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar3 / SEXT816(nbCols),0) < nbRows)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8,in_RSI,SUB168(auVar3 % SEXT816(nbCols),0));
    *puVar5 = operator_delete;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_38,nbCols * nbRows,nbRows,nbCols);
  if (this->debug_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Predict ",8);
    poVar4 = std::ostream::_M_insert<double>(delta_t);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  GenerateAugmentedSigmaPoints(this,&this->x_,&this->P_,(MatrixXd *)&local_38);
  SigmaPointPrediction(this,delta_t,(MatrixXd *)&local_38,&this->Xsig_pred_);
  PredictMeanAndCovariance(this,&this->Xsig_pred_,&this->x_,&this->P_);
  free(local_38.m_data);
  return;
}

Assistant:

void UnscentedKalmanFilter::Prediction(double delta_t) {

    MatrixXd Xsig_aug(n_aug_, n_sigma_);

    if (debug_)
        std::cout << "Predict " << delta_t << std::endl;
 
    GenerateAugmentedSigmaPoints(x_, P_, Xsig_aug);
    SigmaPointPrediction(delta_t, Xsig_aug, Xsig_pred_);
    PredictMeanAndCovariance(Xsig_pred_, x_, P_);
}